

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GPUShaderFP64Test7::getFragmentShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  _variable_type _Var1;
  pointer p_Var2;
  uint uVar3;
  ostream *poVar4;
  _variable_type type;
  _variable_type type_00;
  int iVar5;
  byte bVar6;
  int iVar7;
  char *this_00;
  ulong uVar8;
  uint n_component;
  ulong uVar9;
  string variable_type_string;
  stringstream array_index_sstream;
  stringstream array_size_sstream;
  stringstream result_sstream;
  uchar local_568;
  undefined7 uStack_567;
  long local_560;
  long local_558 [2];
  ulong local_548;
  ulong local_540;
  ulong local_538;
  _variable *local_530;
  _variable *local_528;
  ulong local_520;
  _variables *local_518;
  string local_510;
  _variable *local_4f0;
  GPUShaderFP64Test7 *local_4e8;
  string *local_4e0;
  ulong local_4d8;
  _variable *local_4d0;
  char *local_4c8;
  long local_4c0;
  undefined1 local_4b8 [112];
  undefined1 local_448 [264];
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  _variable a_Stack_2c0 [22];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_518 = variables;
  local_4e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 400\n\n",0xe);
  this_00 = "in GS_DATA\n{\n";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in GS_DATA\n{\n",0xd);
  getVariableDeclarations_abi_cxx11_
            ((string *)local_340,(GPUShaderFP64Test7 *)this_00,"gs",local_518,"flat");
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"};\n\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "out vec4 result;\n\nvoid main()\n{\nconst double epsilon = 1e-5;\n\nresult = vec4(1, 0, 0, 0);\n\n"
             ,0x5a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != local_330) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  local_4f0 = (local_518->
              super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_4d0 = (local_518->
              super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_4d8 = ((long)local_4d0 - (long)local_4f0 >> 2) * -0x5555555555555555;
  if (local_4d0 != local_4f0) {
    local_528 = (_variable *)local_448;
    local_530 = a_Stack_2c0;
    uVar9 = 0;
    uVar8 = 1;
    local_4e8 = this;
    do {
      p_Var2 = (local_518->
               super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_548 = (ulong)p_Var2[uVar9].array_size;
      _Var1 = p_Var2[uVar9].type;
      local_520 = uVar9;
      uVar3 = Utils::getNumberOfComponentsForVariableType(_Var1);
      Utils::getVariableTypeString_abi_cxx11_(&local_510,(Utils *)(ulong)_Var1,type);
      std::__cxx11::stringstream::stringstream((stringstream *)local_340);
      if (1 < (_variable_type)local_548) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_510._M_dataplus._M_p,local_510._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," expected_variable",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_4c8,local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n\n",3);
      if (local_4c8 != local_4b8) {
        operator_delete(local_4c8,local_4b8._0_8_ + 1);
      }
      if (local_548 != 0) {
        local_540 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_4c8);
          local_538 = uVar8;
          if (1 < (_variable_type)local_548) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"[",1);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"expected_variable",0x11);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(char *)CONCAT71(uStack_567,local_568),local_560);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_510._M_dataplus._M_p,local_510._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
          if ((long *)CONCAT71(uStack_567,local_568) != local_558) {
            operator_delete((long *)CONCAT71(uStack_567,local_568),local_558[0] + 1);
          }
          iVar7 = 0;
          do {
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            if (uVar3 + iVar7 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            }
            iVar7 = iVar7 + -1;
          } while (uVar3 + iVar7 != 0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
          iVar5 = (int)local_538;
          uVar8 = (ulong)(uint)(iVar5 - iVar7);
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_4c8);
          std::ios_base::~ios_base((ios_base *)local_528);
          local_540 = local_540 + 1;
        } while (local_540 != local_548);
        uVar8 = (ulong)(uint)(iVar5 - iVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      std::ios_base::~ios_base((ios_base *)local_530);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
      uVar9 = (ulong)((int)local_520 + 1);
    } while (uVar9 < local_4d8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"if (",4);
  if (local_4d0 != local_4f0) {
    local_4e8 = (GPUShaderFP64Test7 *)local_448;
    local_4f0 = a_Stack_2c0;
    uVar9 = 0;
    do {
      p_Var2 = (local_518->
               super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_530 = (_variable *)(ulong)p_Var2[uVar9].array_size;
      _Var1 = p_Var2[uVar9].type;
      local_538 = uVar9;
      uVar3 = Utils::getNumberOfComponentsForVariableType(_Var1);
      local_540 = CONCAT44(local_540._4_4_,uVar3);
      local_548 = CONCAT44(local_548._4_4_,_Var1);
      Utils::getVariableTypeString_abi_cxx11_(&local_510,(Utils *)(ulong)_Var1,type_00);
      if (local_530 != (_variable *)0x0) {
        bVar6 = _Var1 < VARIABLE_TYPE_UINT & (byte)(0x7fc03fe0 >> ((byte)_Var1 & 0x1f));
        local_520 = local_540 & 0xffffffff;
        local_528 = (_variable *)0x0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)local_340);
          if ((int)local_530 != 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[",1);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
          }
          uVar9 = 0;
          do {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_4c8);
            if (1 < (uint)local_540) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"[",1);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"abs(expected_variable",0x15);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,(char *)CONCAT71(uStack_567,local_568),local_560);
            if ((long *)CONCAT71(uStack_567,local_568) != local_558) {
              operator_delete((long *)CONCAT71(uStack_567,local_568),local_558[0] + 1);
            }
            if (bVar6 == 0) {
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)CONCAT71(uStack_567,local_568),local_560);
              if ((long *)CONCAT71(uStack_567,local_568) != local_558) {
                operator_delete((long *)CONCAT71(uStack_567,local_568),local_558[0] + 1);
              }
            }
            else {
              uVar3 = Utils::getNumberOfColumnsForVariableType((_variable_type)local_548);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"].",2);
              local_568 = Utils::getComponentAtIndex((uint)((uVar9 & 0xffffffff) / (ulong)uVar3));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_568,1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," - gs_variable",0xe);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,(char *)CONCAT71(uStack_567,local_568),local_560);
            if ((long *)CONCAT71(uStack_567,local_568) != local_558) {
              operator_delete((long *)CONCAT71(uStack_567,local_568),local_558[0] + 1);
            }
            if (bVar6 == 0) {
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)CONCAT71(uStack_567,local_568),local_560);
              if ((long *)CONCAT71(uStack_567,local_568) != local_558) {
                operator_delete((long *)CONCAT71(uStack_567,local_568),local_558[0] + 1);
              }
            }
            else {
              uVar3 = Utils::getNumberOfColumnsForVariableType((_variable_type)local_548);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"].",2);
              local_568 = Utils::getComponentAtIndex((uint)((uVar9 & 0xffffffff) / (ulong)uVar3));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_568,1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,") <= epsilon &&",0xf);
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_4c8);
            std::ios_base::~ios_base((ios_base *)local_4e8);
            uVar9 = uVar9 + 1;
          } while (local_520 != uVar9);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
          std::ios_base::~ios_base((ios_base *)local_4f0);
          local_528 = (_variable *)((long)&local_528->attribute_location + 1);
        } while (local_528 != local_530);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
      uVar9 = (ulong)((int)local_538 + 1);
    } while (uVar9 < local_4d8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"true)\n{\n    result = vec4(0, 1, 0, 0);\n}\n}\n",0x2b);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_4e0;
}

Assistant:

std::string GPUShaderFP64Test7::getFragmentShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"

				   /* Add input block */
				   << "in GS_DATA\n"
					  "{\n"
				   << getVariableDeclarations("gs", variables, "flat") << "};\n"
																		  "\n"

				   /* Add output variable */
				   << "out vec4 result;\n"
					  "\n"

					  /* Add main() definition */
					  "void main()\n"
					  "{\n"
					  "const double epsilon = 1e-5;\n"
					  "\n"
					  "result = vec4(1, 0, 0, 0);\n"
					  "\n";

	/* Determine expected values first */
	unsigned int base_counter = 1;
	const size_t n_variables  = variables.size();

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		std::stringstream array_size_sstream;

		if (variable_array_size > 1)
		{
			array_size_sstream << "[" << variable_array_size << "]";
		}

		/* Local variable declaration */
		result_sstream << variable_type_string << " expected_variable" << n_variable << array_size_sstream.str()
					   << ";\n"
						  "\n";

		/* Set expected values */
		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			std::stringstream array_index_sstream;

			if (variable_array_size > 1)
			{
				array_index_sstream << "[" << index << "]";
			}

			result_sstream << "expected_variable" << n_variable << array_index_sstream.str() << " = "
						   << variable_type_string << "(";

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				unsigned int expected_value =
					(base_counter + 0) + (base_counter + 1) + (base_counter + 2) + (base_counter + 3);

				if (m_are_double_inputs_supported)
				{
					/* VS input attributes */
					//expected_value += (base_counter + 6);
					expected_value -= 1;
				}

				result_sstream << expected_value;

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}

				++base_counter;
			} /* for (all components) */

			result_sstream << ");\n";
		} /* for (all array indices) */

		result_sstream << "\n";
	} /* for (all variable types) */

	/* Now that we know the expected values, do a huge conditional check to verify if all
	 * input variables carry correct information.
	 */
	result_sstream << "if (";

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		bool				  is_variable_type_matrix	= Utils::isMatrixVariableType(variable_type);
		unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			std::stringstream array_index_sstream;

			if (variable_array_size > 1)
			{
				array_index_sstream << "[" << index << "]";
			}

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				std::stringstream component_index_sstream;

				if (n_variable_type_components > 1)
				{
					component_index_sstream << "[" << n_component << "]";
				}

				result_sstream << "abs(expected_variable" << n_variable << array_index_sstream.str();

				if (is_variable_type_matrix)
				{
					const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
					const unsigned int column	= n_component % n_columns;
					const unsigned int row		 = n_component / n_columns;

					result_sstream << "[" << column << "]"
													   "."
								   << Utils::getComponentAtIndex(row);
				}
				else
				{
					result_sstream << component_index_sstream.str();
				}

				result_sstream << " - gs_variable" << n_variable << array_index_sstream.str();

				if (is_variable_type_matrix)
				{
					const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
					const unsigned int column	= n_component % n_columns;
					const unsigned int row		 = n_component / n_columns;

					result_sstream << "[" << column << "]"
													   "."
								   << Utils::getComponentAtIndex(row);
				}
				else
				{
					result_sstream << component_index_sstream.str();
				}

				result_sstream << ") <= epsilon &&";
			} /* for (all components) */
		}	 /* for (all array indices) */
	}		  /* for (all variable types) */

	result_sstream << "true)\n"
					  "{\n"
					  "    result = vec4(0, 1, 0, 0);\n"
					  "}\n"
					  "}\n";

	/* All done */
	return result_sstream.str();
}